

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PFlushLineImpl(TidyDocImpl *doc)

{
  int iVar1;
  uint uVar2;
  Bool BVar3;
  int iVar4;
  ulong uVar5;
  
  iVar1 = (doc->pprint).indent[0].spaces;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  if ((doc->config).value[0x5d].v <= (ulong)(iVar4 + (doc->pprint).linelen)) {
    WrapLine(doc);
  }
  BVar3 = WantIndent(doc);
  if (BVar3 != no) {
    WriteIndentChar(doc);
  }
  for (uVar5 = 0; uVar2 = (doc->pprint).linelen, uVar5 < uVar2; uVar5 = uVar5 + 1) {
    prvTidyWriteChar((doc->pprint).linebuf[uVar5],doc->docOut);
  }
  iVar1 = (doc->pprint).indent[0].attrStringStart;
  if (iVar1 < (int)uVar2 && -1 < iVar1) {
    prvTidyWriteChar(0x5c,doc->docOut);
  }
  ResetLine(&doc->pprint);
  (doc->pprint).linelen = 0;
  return;
}

Assistant:

static void PFlushLineImpl( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;

    uint i;

    CheckWrapLine( doc );

    if ( WantIndent(doc) )
        WriteIndentChar(doc);

    for ( i = 0; i < pprint->linelen; ++i )
        TY_(WriteChar)( pprint->linebuf[i], doc->docOut );

    if ( IsInString(pprint) )
        TY_(WriteChar)( '\\', doc->docOut );
    ResetLine( pprint );
    pprint->linelen = 0;
}